

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeParameterIndex(Vdbe *p,char *zName,int nName)

{
  char *__s1;
  int iVar1;
  char *z;
  int i;
  int nName_local;
  char *zName_local;
  Vdbe *p_local;
  
  if ((p != (Vdbe *)0x0) && (zName != (char *)0x0)) {
    for (z._0_4_ = 0; (int)z < p->nzVar; z._0_4_ = (int)z + 1) {
      __s1 = p->azVar[(int)z];
      if (((__s1 != (char *)0x0) && (iVar1 = strncmp(__s1,zName,(long)nName), iVar1 == 0)) &&
         (__s1[nName] == '\0')) {
        return (int)z + 1;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeParameterIndex(Vdbe *p, const char *zName, int nName){
  int i;
  if( p==0 ){
    return 0;
  }
  if( zName ){
    for(i=0; i<p->nzVar; i++){
      const char *z = p->azVar[i];
      if( z && strncmp(z,zName,nName)==0 && z[nName]==0 ){
        return i+1;
      }
    }
  }
  return 0;
}